

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Vec_Ptr_t * createMonotoneBarrierLO(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  int nCap;
  Aig_Obj_t *Entry;
  undefined4 local_3c;
  int i;
  Aig_Obj_t *pObj;
  int barrierCount;
  Vec_Ptr_t *vMonotoneLO;
  Vec_Ptr_t *vBarriers_local;
  Aig_Man_t *pAigNew_local;
  
  if (vBarriers == (Vec_Ptr_t *)0x0) {
    pAigNew_local = (Aig_Man_t *)0x0;
  }
  else {
    nCap = Vec_PtrSize(vBarriers);
    if (nCap < 1) {
      pAigNew_local = (Aig_Man_t *)0x0;
    }
    else {
      pAigNew_local = (Aig_Man_t *)Vec_PtrAlloc(nCap);
      for (local_3c = 0; local_3c < nCap; local_3c = local_3c + 1) {
        Entry = Aig_ObjCreateCi(pAigNew);
        Vec_PtrPush((Vec_Ptr_t *)pAigNew_local,Entry);
      }
    }
  }
  return (Vec_Ptr_t *)pAigNew_local;
}

Assistant:

Vec_Ptr_t *createMonotoneBarrierLO( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers )
{
	Vec_Ptr_t *vMonotoneLO;
	int barrierCount;
	Aig_Obj_t *pObj;
	int i;

	if( vBarriers == NULL )
		return NULL;

	barrierCount = Vec_PtrSize(vBarriers);
	if( barrierCount <= 0 )
		return NULL;

	vMonotoneLO = Vec_PtrAlloc(barrierCount);	
	for( i=0; i<barrierCount; i++ )
	{
		pObj = Aig_ObjCreateCi( pAigNew );
		Vec_PtrPush( vMonotoneLO, pObj );
	}

	return vMonotoneLO;
}